

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O1

int __thiscall zmq::socket_base_t::query_pipes_stats(socket_base_t *this)

{
  int *piVar1;
  size_type i;
  long lVar2;
  long lVar3;
  scoped_lock_t lock;
  scoped_lock_t sStack_28;
  
  scoped_lock_t::scoped_lock_t(&sStack_28,&this->_monitor_sync);
  if ((this->_monitor_events & 0x10000) == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    scoped_lock_t::~scoped_lock_t(&sStack_28);
  }
  else {
    scoped_lock_t::~scoped_lock_t(&sStack_28);
    lVar3 = (long)(this->_pipes)._items.
                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->_pipes)._items.
                  super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar3 != 0) {
      lVar2 = 0;
      do {
        pipe_t::send_stats_to_peer
                  ((this->_pipes)._items.
                   super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2],&this->super_own_t);
        lVar2 = lVar2 + 1;
      } while (lVar3 >> 3 != lVar2);
      return 0;
    }
    piVar1 = __errno_location();
    *piVar1 = 0xb;
  }
  return -1;
}

Assistant:

int zmq::socket_base_t::query_pipes_stats ()
{
    {
        scoped_lock_t lock (_monitor_sync);
        if (!(_monitor_events & ZMQ_EVENT_PIPES_STATS)) {
            errno = EINVAL;
            return -1;
        }
    }
    if (_pipes.size () == 0) {
        errno = EAGAIN;
        return -1;
    }
    for (pipes_t::size_type i = 0, size = _pipes.size (); i != size; ++i) {
        _pipes[i]->send_stats_to_peer (this);
    }

    return 0;
}